

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOpaqueAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_4::OpaqueAttribute::readValueFrom(OpaqueAttribute *this,IStream *is,int size,int version)

{
  undefined4 in_ECX;
  int in_EDX;
  IStream *in_RSI;
  char *in_RDI;
  
  Array<char>::resizeErase((Array<char> *)in_RSI,CONCAT44(in_EDX,in_ECX));
  *(long *)(in_RDI + 0x28) = (long)in_EDX;
  Array::operator_cast_to_char_((Array *)(in_RDI + 0x30));
  Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(in_RSI,in_RDI,0);
  return;
}

Assistant:

void
OpaqueAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    _data.resizeErase (size);
    _dataSize = size;
    Xdr::read<StreamIO> (is, _data, size);
}